

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.hpp
# Opt level: O1

string * EraseComments(string *__return_storage_ptr__,string *content)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  int local_3c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar5 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar5);
  if ((int)content->_M_string_length < 2) {
    return __return_storage_ptr__;
  }
  local_3c = 1;
  bVar7 = false;
  bVar6 = false;
  iVar3 = local_3c;
  do {
    while (bVar7) {
      pcVar2 = (content->_M_dataplus)._M_p;
      if ((pcVar2[local_3c] == '/') && (pcVar2[(long)local_3c + -1] == '*')) {
        bVar7 = false;
      }
LAB_00106b7c:
      iVar3 = local_3c + 1;
      local_3c = iVar3;
      if ((int)content->_M_string_length <= iVar3) {
        return __return_storage_ptr__;
      }
    }
    if (bVar6) {
      std::__cxx11::string::push_back(cVar5);
      pcVar2 = (content->_M_dataplus)._M_p;
      if ((pcVar2[(long)local_3c + -1] == '\\') || (pcVar2[local_3c] != '\"')) {
        bVar6 = false;
      }
      goto LAB_00106b7c;
    }
    pcVar2 = (content->_M_dataplus)._M_p;
    if (pcVar2[(long)iVar3 + -1] == '/') {
      if (pcVar2[iVar3] != '*') {
        if (pcVar2[iVar3] != '/') goto LAB_00106ae3;
        std::__cxx11::string::pop_back();
        iVar4 = iVar3 + -1;
        pcVar8 = (content->_M_dataplus)._M_p + iVar3;
        do {
          iVar4 = iVar4 + 1;
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar1 != '\n');
        goto LAB_00106b00;
      }
      std::__cxx11::string::pop_back();
      bVar7 = true;
      local_3c = iVar3;
      goto LAB_00106b7c;
    }
LAB_00106ae3:
    if ((pcVar2[(long)iVar3 + -1] != '\\') && (pcVar2[iVar3] == '\"')) {
      bVar6 = true;
      std::__cxx11::string::push_back(cVar5);
      local_3c = iVar3;
      goto LAB_00106b7c;
    }
    std::__cxx11::string::push_back(cVar5);
    iVar4 = iVar3 + 1;
LAB_00106b00:
    iVar3 = iVar4;
    if ((int)content->_M_string_length <= iVar4) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string EraseComments(const std::string &content) {
    std::string result;
    result += content[0];

    bool quoted = false;
    bool commented = false;

    int index = 1;
    while (index < (int)content.size()) {
        if (commented) {
            if (content[index] == '/' and content[index - 1] == '*') {
                commented = false;
            }
            index++;
            continue;
        }

        if (quoted) {
            result += content[index];
            if (content[index - 1] != '\\' and content[index] == '"') {
                ;
            } else {
                quoted = false;
            }
            index++;
            continue;
        }

        if (content[index - 1] == '/' and content[index] == '*') {
            result.pop_back();
            commented = true;
            index++;
            continue;
        }

        if (content[index - 1] == '/' and content[index] == '/') {
            result.pop_back();
            while (content[index] != '\n') {
                index++;
            }
            continue;
        }

        if (content[index - 1] != '\\' and content[index] == '\"') {
            quoted = true;
            result += content[index];
            index++;
            continue;
        }

        result += content[index];
        index++;
    }
    return result;
}